

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  xmlEntityPtr pxVar1;
  _xmlDict *dict;
  
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    if (doc->intSubset != (_xmlDtd *)0x0) {
      pxVar1 = xmlAddDocEntity(doc,name,type,ExternalID,SystemID,content);
      return pxVar1;
    }
    dict = doc->dict;
  }
  pxVar1 = xmlCreateEntity(dict,name,type,ExternalID,SystemID,content);
  if (pxVar1 == (xmlEntityPtr)0x0) {
    pxVar1 = (xmlEntityPtr)0x0;
  }
  else {
    pxVar1->doc = doc;
  }
  return pxVar1;
}

Assistant:

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc, const xmlChar *name, int type,
	     const xmlChar *ExternalID, const xmlChar *SystemID,
	     const xmlChar *content) {
    xmlEntityPtr ret;
    xmlDictPtr dict;

    if ((doc != NULL) && (doc->intSubset != NULL)) {
	return(xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content));
    }
    if (doc != NULL)
        dict = doc->dict;
    else
        dict = NULL;
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = doc;
    return(ret);
}